

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try_signal.cpp
# Opt level: O2

void sig::detail::handler(int signo,siginfo_t *param_2,void *param_3)

{
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_004d3780);
  if (*(__jmp_buf_tag **)(lVar1 + 0x13b8) == (__jmp_buf_tag *)0x0) {
    signal(signo,(__sighandler_t)0x0);
    raise(signo);
    return;
  }
  siglongjmp(*(__jmp_buf_tag **)(lVar1 + 0x13b8),signo);
}

Assistant:

void handler(int const signo, siginfo_t*, void*)
{
	std::atomic_signal_fence(std::memory_order_acquire);
	if (jmpbuf)
		siglongjmp(*jmpbuf, signo);

	// this signal was not caused within the scope of a try_signal object,
	// invoke the default handler
	signal(signo, SIG_DFL);
	raise(signo);
}